

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter.cpp
# Opt level: O2

double testExtendedKalmanFilter(void)

{
  Scalar SVar1;
  double *pdVar2;
  Index IVar3;
  RealScalar RVar4;
  Index IVar5;
  int iVar6;
  Index IVar7;
  Scalar *pSVar8;
  Scalar *pSVar9;
  InputVector *k;
  long lVar10;
  MeasureVector *pMVar11;
  long lVar12;
  uint uVar13;
  InputVector *pIVar14;
  ulong index;
  bool bVar15;
  Amatrix a;
  Pmatrix p;
  Matrix<double,__1,_1,_0,__1,_1> *local_bd50;
  StateVector error;
  Rmatrix r;
  StateVector xh;
  Qmatrix q;
  double *local_bcf0;
  Index IStack_bce8;
  KalmanFunctor local_bce0;
  StateVector dx;
  Matrix<double,__1,_1,_0,__1,_1> local_bc58;
  Matrix<double,__1,_1,_0,__1,_1> local_bc48;
  Qmatrix q1;
  Rmatrix r1;
  DenseStorage<double,__1,__1,__1,_0> local_bc08;
  DenseStorage<double,__1,__1,__1,_0> local_bbf0;
  InputVector uk [1001];
  StateVector xk [1001];
  MeasureVector yk [1000];
  
  if (testExtendedKalmanFilter()::f == '\0') {
    iVar6 = __cxa_guard_acquire(&testExtendedKalmanFilter()::f);
    if (iVar6 != 0) {
      stateObservation::ExtendedKalmanFilter::ExtendedKalmanFilter
                ((ExtendedKalmanFilter *)testExtendedKalmanFilter()::f,4,3,1,true,true);
      __cxa_atexit(stateObservation::ExtendedKalmanFilter::~ExtendedKalmanFilter,
                   testExtendedKalmanFilter()::f,&__dso_handle);
      __cxa_guard_release(&testExtendedKalmanFilter()::f);
    }
  }
  memset(xk,0,0x3e90);
  pMVar11 = yk;
  memset(pMVar11,0,16000);
  pIVar14 = uk;
  memset(pIVar14,0,0x3e90);
  stateObservation::KalmanFilterBase::getRmatrixRandom();
  p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x3f847ae147ae147b;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_bce0,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&a,(double *)&p);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&r1,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_bce0);
  free(a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  stateObservation::KalmanFilterBase::getQmatrixRandom();
  p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x3f847ae147ae147b;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_bce0,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&a,(double *)&p);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&q1,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_bce0);
  free(a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  stateObservation::DynamicalSystemFunctorBase::DynamicalSystemFunctorBase
            (&local_bce0.super_DynamicalSystemFunctorBase);
  local_bce0._0_8_ = &PTR__KalmanFunctor_00125be8;
  local_bce0.s_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_bce0.s_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_bce0.t_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_bce0.t_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_bce0.m_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_bce0.m_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_bce0.n_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_bce0.n_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_bce0.a_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_bce0.a_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  local_bce0.a_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  local_bce0.c_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_bce0.c_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  local_bce0.c_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  stateObservation::ObserverBase::stateVectorRandom();
  r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x3fb999999999999a;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&a,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&p,(double *)&r);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            (&local_bce0.s_,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&a);
  free(p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  stateObservation::ObserverBase::measureVectorRandom();
  r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x3fb999999999999a;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&a,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&p,(double *)&r);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            (&local_bce0.m_,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&a);
  free(p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  stateObservation::ObserverBase::stateVectorRandom();
  IVar3 = local_bce0.t_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  pdVar2 = local_bce0.t_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  local_bce0.t_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
  local_bce0.t_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = pdVar2;
  a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = IVar3;
  free(pdVar2);
  stateObservation::ObserverBase::measureVectorRandom();
  IVar3 = local_bce0.n_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  pdVar2 = local_bce0.n_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  local_bce0.n_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
  local_bce0.n_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = pdVar2;
  a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = IVar3;
  free(pdVar2);
  stateObservation::KalmanFilterBase::getAmatrixRandom();
  r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x3fe3333333333333;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&a,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&p,(double *)&r);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            (&local_bce0.a_,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&a);
  free(p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  stateObservation::KalmanFilterBase::getCmatrixRandom();
  IVar5 = local_bce0.c_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols;
  IVar3 = local_bce0.c_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows;
  pdVar2 = local_bce0.c_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data;
  local_bce0.c_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
  local_bce0.c_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  local_bce0.c_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = pdVar2;
  a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = IVar3;
  a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = IVar5;
  free(pdVar2);
  stateObservation::ObserverBase::stateVectorZero();
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
            (xk,(Matrix<double,__1,_1,_0,__1,_1> *)&p);
  stateObservation::ObserverBase::inputVectorRandom();
  IVar3 = uk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  pdVar2 = uk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  uk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
  uk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = IVar3;
  a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = pdVar2;
  free(pdVar2);
  lVar12 = 1000;
  local_bd50 = xk;
  lVar10 = 1;
  while (local_bd50 = local_bd50 + 1, bVar15 = lVar12 != 0, lVar12 = lVar12 + -1, bVar15) {
    stateObservation::ObserverBase::inputVectorRandom();
    pdVar2 = pIVar14[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    pIVar14[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
    IVar3 = pIVar14[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    pIVar14[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = IVar3;
    a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = pdVar2;
    free(pdVar2);
    stateObservation::ObserverBase::stateVectorZero();
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              (&local_bbf0,(DenseStorage<double,__1,__1,__1,_0> *)&q1);
    IVar7 = stateObservation::ObserverBase::getStateSize();
    stateObservation::tools::ProbabilityLawSimulation::
    getGaussianMatrix<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              ((ProbabilityLawSimulation *)&r,&local_bc48,
               (Matrix<double,__1,__1,_0,__1,__1> *)&local_bbf0,IVar7,1);
    free(local_bbf0.m_data);
    free(local_bc48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
    ;
    stateObservation::ObserverBase::measureVectorZero();
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              (&local_bc08,(DenseStorage<double,__1,__1,__1,_0> *)&r1);
    IVar7 = stateObservation::ObserverBase::getMeasureSize();
    stateObservation::tools::ProbabilityLawSimulation::
    getGaussianMatrix<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              ((ProbabilityLawSimulation *)&q,&local_bc58,
               (Matrix<double,__1,__1,_0,__1,__1> *)&local_bc08,IVar7,1);
    free(local_bc08.m_data);
    free(local_bc58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
    ;
    k = pIVar14;
    testExtendedKalmanFilter()::KalmanFunctor::stateDynamics(Eigen::
    Matrix<double,-1,1,0,-1,1>const&,Eigen::Matrix<double,_1,1,0,_1,1>_const__long_
              ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&error,(StateVector *)&local_bce0,
               (InputVector *)&p,(TimeIndex)pIVar14);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&a,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&error,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&r);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&p,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&a);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (local_bd50,(Matrix<double,__1,_1,_0,__1,_1> *)&p);
    free(error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    testExtendedKalmanFilter()::KalmanFunctor::measureDynamics(Eigen::
    Matrix<double,-1,1,0,-1,1>const&,Eigen::Matrix<double,_1,1,0,_1,1>_const__long_
              ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&error,(StateVector *)&local_bce0,
               (InputVector *)&p,(TimeIndex)k);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&a,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&error,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&q);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              (pMVar11,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)&a);
    free(error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
    free(r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
    pIVar14 = pIVar14 + 1;
    pMVar11 = pMVar11 + 1;
  }
  free(p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  stateObservation::ExtendedKalmanFilter::setFunctor
            ((DynamicalSystemFunctorBase *)testExtendedKalmanFilter()::f);
  stateObservation::ObserverBase::stateVectorRandom();
  stateObservation::ZeroDelayObserver::setState((Matrix *)testExtendedKalmanFilter()::f,(long)xk);
  stateObservation::KalmanFilterBase::getPmatrixZero();
  uVar13 = 0;
  while( true ) {
    lVar12 = stateObservation::ObserverBase::getStateSize();
    index = (ulong)uVar13;
    if (lVar12 <= (long)index) break;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&xh,index);
    SVar1 = *pSVar8;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&p,index,
                        index);
    *pSVar9 = SVar1;
    uVar13 = uVar13 + 1;
  }
  r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = (double *)&p
  ;
  a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage._0_16_ =
       Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                 ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&p,
                  (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&r);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            (&p,(Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                 *)&a);
  stateObservation::KalmanFilterBase::setStateCovariance((Matrix *)testExtendedKalmanFilter()::f);
  q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)&r1;
  a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage._0_16_ =
       Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                 ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                  q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_data,(MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *
                         )&q);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&r,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)&a);
  error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)&q1;
  a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage._0_16_ =
       Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                 ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                  error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data,(MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *
                         )&error);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&q,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)&a);
  stateObservation::KalmanFilterBase::setR((Matrix *)testExtendedKalmanFilter()::f);
  stateObservation::KalmanFilterBase::setQ((Matrix *)testExtendedKalmanFilter()::f);
  stateObservation::ZeroDelayObserver::setInput((Matrix *)testExtendedKalmanFilter()::f,(long)uk);
  stateObservation::ObserverBase::stateVectorConstant(1.0);
  local_bcf0 = (double *)0x3e45798ee2308c3a;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&a,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&error,(double *)&local_bcf0);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&dx,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&a);
  free(error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  pMVar11 = yk;
  pIVar14 = uk;
  for (; pIVar14 = pIVar14 + 1, lVar10 != 0x3e9; lVar10 = lVar10 + 1) {
    stateObservation::ZeroDelayObserver::setMeasurement
              ((Matrix *)testExtendedKalmanFilter()::f,(long)pMVar11);
    stateObservation::ZeroDelayObserver::setInput
              ((Matrix *)testExtendedKalmanFilter()::f,(long)pIVar14);
    stateObservation::ExtendedKalmanFilter::getAMatrixFD((Matrix *)&a);
    stateObservation::ExtendedKalmanFilter::getCMatrixFD((Matrix *)&error);
    stateObservation::KalmanFilterBase::setA((Matrix *)testExtendedKalmanFilter()::f);
    stateObservation::KalmanFilterBase::setC((Matrix *)testExtendedKalmanFilter()::f);
    stateObservation::ZeroDelayObserver::getEstimatedState((long)&local_bcf0);
    IVar3 = xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    pdVar2 = xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = local_bcf0;
    xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IStack_bce8
    ;
    local_bcf0 = pdVar2;
    IStack_bce8 = IVar3;
    free(pdVar2);
    free(error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
    pMVar11 = pMVar11 + 1;
  }
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&a,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&xh,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(xk + 1000));
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&error,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&a);
  RVar4 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&error);
  free(error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(dx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  testExtendedKalmanFilter::KalmanFunctor::~KalmanFunctor(&local_bce0);
  free(q1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(r1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  lVar10 = 16000;
  do {
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::~DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)
               ((long)&uk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data + lVar10));
    lVar10 = lVar10 + -0x10;
  } while (lVar10 != -0x10);
  lVar10 = 0x3e70;
  do {
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::~DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)
               ((long)&yk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data + lVar10));
    lVar10 = lVar10 + -0x10;
  } while (lVar10 != -0x10);
  lVar10 = 16000;
  do {
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::~DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)
               ((long)&xk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data + lVar10));
    lVar10 = lVar10 + -0x10;
  } while (lVar10 != -0x10);
  return RVar4;
}

Assistant:

double testExtendedKalmanFilter()
{
  /// the number of samples
  const static stateObservation::Index kmax = 1000;

  /// define the type of the extended Kalman filter
  typedef stateObservation::ExtendedKalmanFilter ekf;

  /// instanciation of the extended Kalman filter
  static ekf f(4, 3, 1);

  /// The functor that describes the dynamics of the state
  /// and the measurement
  class KalmanFunctor : public stateObservation::DynamicalSystemFunctorBase
  {

  public:
    /// Constructor
    KalmanFunctor()
    {
      s_ = f.stateVectorRandom() * 0.1;
      m_ = f.measureVectorRandom() * 0.1;
      t_ = f.stateVectorRandom();
      n_ = f.measureVectorRandom();
      a_ = f.getAmatrixRandom() * 0.6;
      c_ = f.getCmatrixRandom();
    }

    /// The dynamics of the state xk1=f(xk,u,k)
    virtual ekf::StateVector stateDynamics(const ekf::StateVector & xk,
                                           const ekf::InputVector & u,
                                           stateObservation::TimeIndex k)
    {
      (void)k; // unused
      (void)u; // unused

      ekf::StateVector xk1;

      xk1 = a_ * xk + cos(10 * (xk.transpose() * xk)[0]) * s_ + t_ + (u.transpose() * u)(0, 0) * s_;
      return xk1;
    }

    /// The dynamics of the state yk=h(xk,u,k)
    virtual ekf::MeasureVector measureDynamics(const ekf::StateVector & xk,
                                               const ekf::InputVector & u,
                                               stateObservation::TimeIndex k)
    {
      (void)k; // unused
      (void)u; // unused

      ekf::MeasureVector yk;
      yk = c_ * xk + cos(10 * (xk.transpose() * xk)[0]) * m_ + n_;
      return yk;
    }

    virtual stateObservation::Index getStateSize() const
    {
      return f.getStateSize();
    }

    virtual stateObservation::Index getInputSize() const
    {
      return f.getInputSize();
    }

    virtual stateObservation::Index getMeasurementSize() const
    {
      return f.getMeasureSize();
    }

  private:
    /// containers for the vectors and matrices
    ekf::StateVector s_;
    ekf::StateVector t_;
    ekf::MeasureVector m_;
    ekf::MeasureVector n_;

    ekf::Amatrix a_;
    ekf::Cmatrix c_;
  };

  /// containers for the state, the measurements and the input
  ekf::StateVector xk[kmax + 1];
  ekf::MeasureVector yk[kmax];
  ekf::InputVector uk[kmax + 1];

  /// the standard deviation matrix to generate the gaussian noise
  ekf::Rmatrix r1 = f.getRmatrixRandom() * 0.01;
  ekf::Qmatrix q1 = f.getQmatrixRandom() * 0.01;

  /// instanciate the functor
  KalmanFunctor func;

  { /// Construction of the sequence of states measurements and inputs

    /// initializations
    ekf::StateVector x = f.stateVectorZero();
    xk[0] = x;
    uk[0] = f.inputVectorRandom();

    for(stateObservation::Index k = 1; k <= kmax; ++k)
    {
      /// generation of random inputs
      uk[k] = f.inputVectorRandom();

      /// generation of Gaussian white noises
      ekf::StateVector v = stateObservation::tools::ProbabilityLawSimulation::getGaussianMatrix(f.stateVectorZero(), q1,
                                                                                                f.getStateSize(), 1);

      ekf::MeasureVector w = stateObservation::tools::ProbabilityLawSimulation::getGaussianMatrix(
          f.measureVectorZero(), r1, f.getMeasureSize());

      /// the dynamics is executed here
      xk[k] = x = func.stateDynamics(x, uk[k - 1], k - 1) + v;
      yk[k - 1] = func.measureDynamics(x, uk[k], k) + w;
    }
  }

  /// set the functor of the extended Kalman filter
  f.setFunctor(&func);

  /// generation of a random initial estimation of the state
  ekf::StateVector xh = f.stateVectorRandom();

  /// set the initial state of the estimator
  f.setState(xk[0], 0);

  /// set the covariance matrix of the initial estimation error
  ekf::Pmatrix p = f.getPmatrixZero();
  for(unsigned i = 0; i < f.getStateSize(); ++i)
  {
    p(i, i) = xh[i];
  }
  p = p * p.transpose();
  f.setStateCovariance(p);

  /// the covariance matrices for the process noise and the measurements noise
  ekf::Rmatrix r(r1 * r1.transpose());
  ekf::Qmatrix q(q1 * q1.transpose());

  /// set the covariance matrices for the extended Kalman filter
  f.setR(r);
  f.setQ(q);

  /// set initial input
  f.setInput(uk[0], 0);

  /// set the derivation step for the finite difference method
  ekf::StateVector dx = f.stateVectorConstant(1) * 1e-8;

  stateObservation::Index i;
  for(i = 1; i <= kmax; ++i)
  {
    /// give the measurements and the inputs at instant i to the ekf
    f.setMeasurement(yk[i - 1], i);
    f.setInput(uk[i], i);

    /// obtain jacobians by finite differences method
    ekf::Amatrix a = f.getAMatrixFD(dx);
    ekf::Cmatrix c = f.getCMatrixFD(dx);

    /// set the jacobians to the ekf
    f.setA(a);
    f.setC(c);

    /// get the estimation of the state at instant i;
    xh = f.getEstimatedState(i);
  }

  ekf::StateVector error = xh - xk[kmax];

  return error.norm();
}